

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

char * string_find(char *it,char *end,char *data)

{
  char *pcVar1;
  _Bool _Var2;
  char *begin;
  char *data_local;
  char *end_local;
  char *it_local;
  
  end_local = it;
  while( true ) {
    pcVar1 = end_local;
    if (end <= end_local) {
      return (char *)0x0;
    }
    _Var2 = skip_string(&end_local,end,data);
    if (_Var2) break;
    end_local = end_local + 1;
  }
  return pcVar1;
}

Assistant:

static inline const char* string_find(const char* it, const char* end, const char* data)
{
    while(it < end) {
        const char* begin = it;
        if(skip_string(&it, end, data))
            return begin;
        ++it;
    }

    return NULL;
}